

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * duckdb::Exception::ConstructMessageRecursive<duckdb::SQLIdentifier>
                   (string *__return_storage_ptr__,string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,SQLIdentifier *param)

{
  pointer pcVar1;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  ExceptionFormatValue local_60;
  
  pcVar1 = (param->raw_string)._M_dataplus._M_p;
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (param->raw_string)._M_string_length);
  ExceptionFormatValue::CreateFormatValue<duckdb::SQLIdentifier>
            (&local_60,(SQLIdentifier *)local_80);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>(values,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.str_val._M_dataplus._M_p != &local_60.str_val.field_2) {
    operator_delete(local_60.str_val._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  ConstructMessageRecursive
            ((string *)__return_storage_ptr__,(string *)msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}